

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O3

void cvode_kinetic(Item *qsol,Symbol *fun,int numeqn,int listnum)

{
  List *pLVar1;
  Item *pIVar2;
  Item *pIVar3;
  short sVar4;
  int iVar5;
  List *pLVar6;
  char *pcVar7;
  List *item;
  Item *pIVar8;
  
  if ((done_list != (List *)0x0) &&
     (pLVar6 = done_list, item = done_list->next, done_list->next != done_list)) {
    do {
      pLVar1 = item->next;
      if ((Symbol *)(item->element).itm == fun) {
        delete(item);
        pLVar6 = done_list;
      }
      item = pLVar1;
    } while (pLVar1 != pLVar6);
  }
  kinetic_intmethod(fun,"NEURON\'s CVode");
  lappendstr(procfunc,"\n/*CVODE ode begin*/\n");
  sprintf(buf,"static int _ode_spec%d() {_reset=0;{\n",(ulong)(uint)(fun->u).i);
  lappendstr(procfunc,buf);
  sprintf(buf,"static int _ode_spec%d(_threadargsproto_) {int _reset=0;{\n",(ulong)(uint)(fun->u).i)
  ;
  vectorize_substitute(procfunc->prev,buf);
  copyitems(cvode_sbegin,cvode_send,procfunc->prev);
  lappendstr(procfunc,"\n/*CVODE matsol*/\n");
  sprintf(buf,"static int _ode_matsol%d() {_reset=0;{\n",(ulong)(uint)(fun->u).i);
  lappendstr(procfunc,buf);
  sprintf(buf,
          "static int _ode_matsol%d(void* _so, double* _rhs, _threadargsproto_) {int _reset=0;{\n",
          (ulong)(uint)(fun->u).i);
  vectorize_substitute(procfunc->prev,buf);
  cvode_flag = 1;
  kinetic_implicit(fun,"dt","ZZZ");
  cvode_flag = 0;
  pIVar2 = procfunc->prev;
  copyitems(cvode_sbegin,cvode_send,pIVar2);
  pIVar3 = procfunc->prev;
joined_r0x0010fdde:
  do {
    do {
      pIVar8 = pIVar2;
      if (pIVar8 == pIVar3) {
        lappendstr(procfunc,"\n/*CVODE end*/\n");
        return;
      }
      pIVar2 = pIVar8->next;
    } while (pIVar8->itemtype != 1);
    pcVar7 = ((pIVar8->element).sym)->name;
    iVar5 = strcmp(pcVar7,"f_flux");
  } while ((iVar5 != 0) && (iVar5 = strcmp(pcVar7,"b_flux"), iVar5 != 0));
  sVar4 = 1;
  do {
    if (sVar4 == 1) {
      if (*((pIVar8->element).sym)->name == ';') break;
    }
    else if ((sVar4 == 0x143) &&
            (pcVar7 = strchr((pIVar8->element).str,0x3b), pcVar7 != (char *)0x0)) break;
    pIVar8 = pIVar8->prev;
    sVar4 = pIVar8->itemtype;
  } while( true );
  pIVar8 = pIVar8->next;
  while ((pIVar8->itemtype != 1 || (*((pIVar8->element).sym)->name != ';'))) {
    pIVar2 = pIVar8->next;
    delete(pIVar8);
    pIVar8 = pIVar2;
  }
  pIVar2 = pIVar8->next;
  delete(pIVar8);
  goto joined_r0x0010fdde;
}

Assistant:

void cvode_kinetic(qsol, fun, numeqn, listnum)
	Item* qsol;
	Symbol* fun;
	int numeqn, listnum;
{
#if 1
	Item* qn;
	int out;
	Item* q, *pbeg, *pend, *qnext;
	/* get a list of the original items so we can keep removing
	   the added ones to get back to the original list.
	*/
	if (done_list) for (q = done_list->next; q != done_list; q = qn) {
		qn = q->next;
		if (SYM(q) == fun) {
			delete(q);
		}
	}
	kinetic_intmethod(fun, "NEURON's CVode");
	Lappendstr(procfunc, "\n/*CVODE ode begin*/\n");
	sprintf(buf, "static int _ode_spec%d() {_reset=0;{\n", fun->u.i);
	Lappendstr(procfunc, buf);
	sprintf(buf, "static int _ode_spec%d(_threadargsproto_) {int _reset=0;{\n", fun->u.i);
	vectorize_substitute(procfunc->prev, buf);
	copyitems(cvode_sbegin, cvode_send, procfunc->prev);

	Lappendstr(procfunc, "\n/*CVODE matsol*/\n");
	sprintf(buf, "static int _ode_matsol%d() {_reset=0;{\n", fun->u.i);
	Lappendstr(procfunc, buf);
	sprintf(buf, "static int _ode_matsol%d(void* _so, double* _rhs, _threadargsproto_) {int _reset=0;{\n", fun->u.i);
	vectorize_substitute(procfunc->prev, buf);
	cvode_flag = 1;
	kinetic_implicit(fun, "dt", "ZZZ");
	cvode_flag = 0;
	pbeg = procfunc->prev;
	copyitems(cvode_sbegin, cvode_send, procfunc->prev);
	pend = procfunc->prev;
#if 1
	/* remove statements containing f_flux or b_flux */
	for (q = pbeg; q != pend; q = qnext) {
		qnext = q->next;
		if (q->itemtype == SYMBOL && 
		  (strcmp(SYM(q)->name, "f_flux") == 0 || 
		   strcmp(SYM(q)->name, "b_flux") == 0 )) {
		  
			/* find the beginning of the statement */
			out = 0;
			for (;;) {
				switch(q->itemtype) {
				case STRING:
					if (strchr(STR(q), ';')) {
						out = 1;
					}
					break;
				case SYMBOL:
					if (SYM(q)->name[0] == ';') {
						out = 1;
					}
					break;
				}
				if (out) {
					break;
				}
				q = q->prev;
			}
			q = q->next;
			/* delete the statement */
			while (q->itemtype != SYMBOL || SYM(q)->name[0] != ';') {
				qnext = q->next;
				delete(q);
				q = qnext;
			}
			qnext = q->next;
			delete(q);
		}
	}
#endif
	Lappendstr(procfunc, "\n/*CVODE end*/\n");

#endif
}